

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_memory.c
# Opt level: O2

int archive_write_open_memory(archive *a,void *buff,size_t buffSize,size_t *used)

{
  int iVar1;
  void *client_data;
  
  client_data = calloc(1,0x20);
  if (client_data != (void *)0x0) {
    *(void **)((long)client_data + 0x18) = buff;
    *(size_t *)((long)client_data + 8) = buffSize;
    *(size_t **)((long)client_data + 0x10) = used;
    iVar1 = archive_write_open(a,client_data,memory_write_open,memory_write,memory_write_close);
    return iVar1;
  }
  archive_set_error(a,0xc,"No memory");
  return -0x1e;
}

Assistant:

int
archive_write_open_memory(struct archive *a, void *buff, size_t buffSize, size_t *used)
{
	struct write_memory_data *mine;

	mine = (struct write_memory_data *)malloc(sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	memset(mine, 0, sizeof(*mine));
	mine->buff = buff;
	mine->size = buffSize;
	mine->client_size = used;
	return (archive_write_open(a, mine,
		    memory_write_open, memory_write, memory_write_close));
}